

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

UniValue * __thiscall
DescribeAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeAddressVisitor *this,WitnessUnknown *id)

{
  pointer puVar1;
  string str;
  string key;
  string key_00;
  string key_01;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  undefined1 in_stack_fffffffffffffe28 [15];
  allocator<char> in_stack_fffffffffffffe37;
  allocator<char> aVar2;
  uint in_stack_fffffffffffffe38;
  uint uVar3;
  undefined1 in_stack_fffffffffffffe3c [12];
  UniValue in_stack_fffffffffffffe48;
  string local_150 [32];
  UniValue local_130;
  string local_d8 [32];
  UniValue local_b8;
  string local_60 [32];
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  str._M_string_length._7_1_ = in_stack_fffffffffffffe37;
  str._0_15_ = in_stack_fffffffffffffe28;
  str.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe38;
  str.field_2._4_12_ = in_stack_fffffffffffffe3c;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"iswitness",(allocator<char> *)&stack0xfffffffffffffe38);
  aVar2 = (allocator<char>)0x1;
  UniValue::UniValue<bool,_bool,_true>(&local_b8,(bool *)&stack0xfffffffffffffe37);
  key._M_string_length._7_1_ = aVar2;
  key._0_15_ = in_stack_fffffffffffffe28;
  key.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe38;
  key.field_2._4_12_ = in_stack_fffffffffffffe3c;
  UniValue::pushKV(__return_storage_ptr__,key,in_stack_fffffffffffffe48);
  UniValue::~UniValue(&local_b8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"witness_version",(allocator<char> *)&stack0xfffffffffffffe37);
  uVar3 = id->m_version;
  UniValue::UniValue<unsigned_int,_unsigned_int,_true>(&local_130,(uint *)&stack0xfffffffffffffe38);
  key_00._M_string_length._7_1_ = aVar2;
  key_00._0_15_ = in_stack_fffffffffffffe28;
  key_00.field_2._M_allocated_capacity._0_4_ = uVar3;
  key_00.field_2._4_12_ = in_stack_fffffffffffffe3c;
  UniValue::pushKV(__return_storage_ptr__,key_00,in_stack_fffffffffffffe48);
  UniValue::~UniValue(&local_130);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"witness_program",(allocator<char> *)&stack0xfffffffffffffe37);
  puVar1 = (id->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  s.m_size = (long)(id->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  s.m_data = puVar1;
  HexStr_abi_cxx11_((string *)&stack0xfffffffffffffe38,s);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)&stack0xfffffffffffffe58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffe38);
  key_01._M_string_length._7_1_ = aVar2;
  key_01._0_15_ = in_stack_fffffffffffffe28;
  key_01.field_2._M_allocated_capacity._0_4_ = uVar3;
  key_01.field_2._4_12_ = in_stack_fffffffffffffe3c;
  UniValue::pushKV(__return_storage_ptr__,key_01,in_stack_fffffffffffffe48);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffe58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
  std::__cxx11::string::~string(local_150);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const WitnessUnknown& id) const
    {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("iswitness", true);
        obj.pushKV("witness_version", id.GetWitnessVersion());
        obj.pushKV("witness_program", HexStr(id.GetWitnessProgram()));
        return obj;
    }